

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew,int *aChange,int bChngRowid)

{
  u8 uVar1;
  byte bVar2;
  sqlite3 *db;
  Trigger *pTVar3;
  int iVar4;
  int iVar5;
  Table *pTVar6;
  Vdbe *p;
  i16 *piVar7;
  FKey *pFVar8;
  SrcList *pSrc;
  Parse *pPVar9;
  undefined4 in_register_0000000c;
  Index *pIVar10;
  undefined4 in_register_00000014;
  FKey **ppFVar11;
  long lVar12;
  int *aiCol;
  char *zDbase;
  long lVar13;
  uint isIgnore;
  sColMap *psVar14;
  int *aiFree;
  Parse *local_90;
  int local_84;
  Index *pIdx;
  int local_74;
  undefined8 local_70;
  undefined8 local_68;
  int *local_60;
  Index *local_58;
  ulong local_50;
  int iCol;
  char *local_40;
  i16 *local_38;
  
  local_70 = CONCAT44(in_register_00000014,regOld);
  local_68 = CONCAT44(in_register_0000000c,regNew);
  db = pParse->db;
  if ((db->flags & 0x4000) != 0) {
    uVar1 = pParse->disableTriggers;
    local_74 = bChngRowid;
    local_84 = sqlite3SchemaToIndex(db,pTab->pSchema);
    zDbase = db->aDb[local_84].zDbSName;
    local_50 = CONCAT44(local_50._4_4_,(int)local_70 + 1);
    ppFVar11 = &pTab->pFKey;
    local_90 = pParse;
    local_60 = aChange;
    local_40 = zDbase;
    while (pFVar8 = *ppFVar11, pFVar8 != (FKey *)0x0) {
      pIdx = (Index *)0x0;
      aiFree = (int *)0x0;
      if (((aChange == (int *)0x0) || (iVar4 = sqlite3_stricmp(pTab->zName,pFVar8->zTo), iVar4 == 0)
          ) || (iVar4 = fkChildIsModified(pTab,pFVar8,aChange,local_74), iVar4 != 0)) {
        if (pParse->disableTriggers == '\0') {
          pTVar6 = sqlite3LocateTable(pParse,0,pFVar8->zTo,zDbase);
        }
        else {
          pTVar6 = sqlite3FindTable(db,pFVar8->zTo,zDbase);
        }
        if ((pTVar6 == (Table *)0x0) ||
           (iVar4 = sqlite3FkLocateIndex(pParse,pTVar6,pFVar8,&pIdx,&aiFree), iVar4 != 0)) {
          if (uVar1 == '\0') {
            return;
          }
          if (db->mallocFailed != '\0') {
            return;
          }
          if (pTVar6 == (Table *)0x0) {
            p = sqlite3GetVdbe(pParse);
            iVar5 = pFVar8->nCol;
            iVar4 = p->nOp + iVar5;
            psVar14 = pFVar8->aCol;
            for (lVar12 = 0; lVar12 < iVar5; lVar12 = lVar12 + 1) {
              sqlite3VdbeAddOp2(p,0x32,psVar14->iFrom + (int)local_50,iVar4 + 1);
              iVar5 = pFVar8->nCol;
              psVar14 = psVar14 + 1;
            }
            sqlite3VdbeAddOp2(p,0x96,(uint)pFVar8->isDeferred,-1);
            pParse = local_90;
            zDbase = local_40;
            aChange = local_60;
          }
        }
        else {
          aiCol = aiFree;
          if (aiFree == (int *)0x0) {
            iCol = pFVar8->aCol[0].iFrom;
            aiCol = &iCol;
          }
          local_38 = &pTVar6->iPKey;
          lVar12 = 0;
          isIgnore = 0;
          local_58 = pIdx;
          pIVar10 = pIdx;
          for (lVar13 = 0; iVar4 = local_84, pParse = local_90, lVar13 < pFVar8->nCol;
              lVar13 = lVar13 + 1) {
            if (*(int *)((long)aiCol + lVar12 * 2) == (int)pTab->iPKey) {
              *(undefined4 *)((long)aiCol + lVar12 * 2) = 0xffffffff;
            }
            if (db->xAuth != (sqlite3_xauth)0x0) {
              piVar7 = local_38;
              if (pIVar10 != (Index *)0x0) {
                piVar7 = (i16 *)((long)pIVar10->aiColumn + lVar12);
              }
              iVar4 = sqlite3AuthReadCol(local_90,pTVar6->zName,pTVar6->aCol[*piVar7].zName,local_84
                                        );
              isIgnore = (uint)(iVar4 == 2);
              pIVar10 = local_58;
            }
            lVar12 = lVar12 + 2;
          }
          sqlite3TableLock(local_90,local_84,pTVar6->tnum,'\0',pTVar6->zName);
          pParse->nTab = pParse->nTab + 1;
          if ((int)local_70 != 0) {
            fkLookupParent(pParse,iVar4,pTVar6,local_58,pFVar8,aiCol,(int)local_70,-1,isIgnore);
          }
          if ((int)local_68 != 0) {
            pPVar9 = pParse->pToplevel;
            if (pParse->pToplevel == (Parse *)0x0) {
              pPVar9 = pParse;
            }
            if ((pPVar9->pTriggerPrg == (TriggerPrg *)0x0) ||
               (((pTVar3 = pPVar9->pTriggerPrg->pTrigger, pTVar3 != pFVar8->apTrigger[0] ||
                 (pFVar8->aAction[0] != '\b')) &&
                ((pTVar3 != pFVar8->apTrigger[1] || (pFVar8->aAction[1] != '\b')))))) {
              fkLookupParent(pParse,local_84,pTVar6,local_58,pFVar8,aiCol,(int)local_68,1,isIgnore);
            }
          }
          sqlite3DbFree(db,aiFree);
          zDbase = local_40;
          aChange = local_60;
        }
      }
      ppFVar11 = &pFVar8->pNextFrom;
    }
    pFVar8 = sqlite3FkReferences(pTab);
    local_50 = (ulong)(aChange != (int *)0x0);
    for (; pFVar8 != (FKey *)0x0; pFVar8 = pFVar8->pNextTo) {
      pIdx = (Index *)0x0;
      aiFree = (int *)0x0;
      if (((aChange == (int *)0x0) ||
          (iVar4 = fkParentIsModified(pTab,pFVar8,aChange,local_74), iVar4 != 0)) &&
         ((pFVar8->isDeferred != '\0' ||
          ((((db->flags & 0x80000) != 0 || (pParse->pToplevel != (Parse *)0x0)) ||
           (pParse->isMultiWrite != '\0')))))) {
        iVar4 = sqlite3FkLocateIndex(pParse,pTab,pFVar8,&pIdx,&aiFree);
        if (iVar4 == 0) {
          pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
          if (pSrc != (SrcList *)0x0) {
            pTVar6 = pFVar8->pFrom;
            pSrc->a[0].pTab = pTVar6;
            pSrc->a[0].zName = pTVar6->zName;
            pTVar6->nTabRef = pTVar6->nTabRef + 1;
            iVar4 = local_90->nTab;
            local_90->nTab = iVar4 + 1;
            pSrc->a[0].iCursor = iVar4;
            if ((int)local_68 != 0) {
              fkScanChildren(local_90,pSrc,pTab,pIdx,pFVar8,aiFree,(int)local_68,-1);
            }
            if ((int)local_70 != 0) {
              bVar2 = pFVar8->aAction[local_50];
              fkScanChildren(local_90,pSrc,pTab,pIdx,pFVar8,aiFree,(int)local_70,1);
              if ((pFVar8->isDeferred == '\0') && ((bVar2 & 0xfd) != 8)) {
                pPVar9 = local_90->pToplevel;
                if (local_90->pToplevel == (Parse *)0x0) {
                  pPVar9 = local_90;
                }
                pPVar9->mayAbort = '\x01';
              }
            }
            pSrc->a[0].zName = (char *)0x0;
            sqlite3SrcListDelete(db,pSrc);
            aChange = local_60;
          }
          sqlite3DbFree(db,aiFree);
          pParse = local_90;
        }
        else {
          if (uVar1 == '\0') {
            return;
          }
          if (db->mallocFailed != '\0') {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */ 
  int regOld,                     /* Previous row data is stored here */
  int regNew,                     /* New row data is stored here */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int bIgnore = 0;

    if( aChange 
     && sqlite3_stricmp(pTab->zName, pFKey->zTo)!=0
     && fkChildIsModified(pTab, pFKey, aChange, bChngRowid)==0 
    ){
      continue;
    }

    /* Find the parent table of this foreign key. Also find a unique index 
    ** on the parent key columns in the parent table. If either of these 
    ** schema items cannot be located, set an error in pParse and return 
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iReg = pFKey->aCol[i].iFrom + regOld + 1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
      assert( pIdx==0 || pIdx->aiColumn[i]>=0 );
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the 
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        bIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate 
    ** a cursor to use to search the unique index on the parent key columns 
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an 
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1, bIgnore);
    }
    if( regNew!=0 && !isSetNullAction(pParse, pFKey) ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint. 
      **
      ** If this operation is being performed as part of a trigger program
      ** that is actually a "SET NULL" action belonging to this very 
      ** foreign key, then omit this scan altogether. As all child key
      ** values are guaranteed to be NULL, it is not possible for adding
      ** this row to cause an FK violation.  */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1, bIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table.
  ** (the "child" constraints) */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( aChange && fkParentIsModified(pTab, pFKey, aChange, bChngRowid)==0 ){
      continue;
    }

    if( !pFKey->isDeferred && !(db->flags & SQLITE_DeferFKs) 
     && !pParse->pToplevel && !pParse->isMultiWrite 
    ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause (or fix)
      ** an immediate foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing the child table.  We need the
    ** child table as a SrcList for sqlite3WhereBegin() */
    pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
    if( pSrc ){
      struct SrcList_item *pItem = pSrc->a;
      pItem->pTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pTab->nTabRef++;
      pItem->iCursor = pParse->nTab++;
  
      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        int eAction = pFKey->aAction[aChange!=0];
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
        /* If this is a deferred FK constraint, or a CASCADE or SET NULL
        ** action applies, then any foreign key violations caused by
        ** removing the parent key will be rectified by the action trigger.
        ** So do not set the "may-abort" flag in this case.
        **
        ** Note 1: If the FK is declared "ON UPDATE CASCADE", then the
        ** may-abort flag will eventually be set on this statement anyway
        ** (when this function is called as part of processing the UPDATE
        ** within the action trigger).
        **
        ** Note 2: At first glance it may seem like SQLite could simply omit
        ** all OP_FkCounter related scans when either CASCADE or SET NULL
        ** applies. The trouble starts if the CASCADE or SET NULL action 
        ** trigger causes other triggers or action rules attached to the 
        ** child table to fire. In these cases the fk constraint counters
        ** might be set incorrectly if any OP_FkCounter related scans are 
        ** omitted.  */
        if( !pFKey->isDeferred && eAction!=OE_Cascade && eAction!=OE_SetNull ){
          sqlite3MayAbort(pParse);
        }
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}